

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
Parser::parameterList_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  Token local_1f8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  int local_134;
  undefined1 local_130 [8];
  Token comma;
  undefined1 local_90 [8];
  Token param;
  Parser *this_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *params;
  
  param._string.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  Tokenizer::getToken((Token *)local_90,this->tokenizer);
  do {
    bVar1 = Token::isCloseParen((Token *)local_90);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    Token::getName_abi_cxx11_((string *)((long)&comma._string.field_2 + 8),(Token *)local_90);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)((long)&comma._string.field_2 + 8));
    std::__cxx11::string::~string((string *)(comma._string.field_2._M_local_buf + 8));
    Tokenizer::getToken((Token *)local_130,this->tokenizer);
    bVar1 = Token::isCloseParen((Token *)local_130);
    if (bVar1) {
      local_134 = 3;
    }
    else {
      bVar1 = Token::isComma((Token *)local_130);
      if (!bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"Parser::parameterList",&local_159);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_180,"Expected an , sign, instead got",&local_181);
        die(this,&local_158,&local_180,(Token *)local_130);
        std::__cxx11::string::~string((string *)&local_180);
        std::allocator<char>::~allocator(&local_181);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
      }
      Tokenizer::getToken(&local_1f8,this->tokenizer);
      Token::operator=((Token *)local_90,&local_1f8);
      Token::~Token(&local_1f8);
      local_134 = 0;
    }
    Token::~Token((Token *)local_130);
  } while (local_134 == 0);
  Tokenizer::ungetToken(this->tokenizer);
  param._string.field_2._M_local_buf[0xf] = '\x01';
  local_134 = 1;
  Token::~Token((Token *)local_90);
  if ((param._string.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string>Parser::parameterList(){
    std::vector<std::string>params;
    Token param = tokenizer.getToken();
    while(!param.isCloseParen()){
        params.push_back(param.getName());
        Token comma = tokenizer.getToken();
        if(comma.isCloseParen()) break;
        if(!comma.isComma())
            die("Parser::parameterList", "Expected an , sign, instead got", comma);
        param = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return params;
}